

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_announce_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  mutex *pmVar1;
  session_settings *psVar2;
  pointer pbVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  udp_tracker_connection *puVar8;
  int ret_1;
  in_addr_t iVar9;
  long lVar10;
  size_type __n;
  _List_node_base *p_Var11;
  int ret;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  _List_node_base *p_Var16;
  pointer pbVar17;
  uchar *puVar18;
  bool bVar19;
  error_code eVar20;
  shared_ptr<libtorrent::aux::request_callback> cb;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ip_list;
  tracker_response resp;
  ipv6_peer_entry local_178;
  undefined6 uStack_166;
  ulong local_160;
  udp_tracker_connection *local_158;
  undefined1 local_150 [32];
  time_point local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  op_queue<boost::asio::detail::wait_op> local_108;
  vector<libtorrent::aux::ipv6_peer_entry,std::allocator<libtorrent::aux::ipv6_peer_entry>>
  local_f8 [8];
  iterator iStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  uint local_40;
  uint uStack_3c;
  int iStack_38;
  int iStack_34;
  
  pcVar14 = buf.m_ptr;
  uVar12 = 0;
  if (0x13 < buf.m_len) {
    timeout_handler::restart_read_timeout((timeout_handler *)this);
    local_a8._M_p = (pointer)&local_98;
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    _local_f8 = (undefined1  [16])0x0;
    local_108.front_ = (wait_op *)0x0;
    local_108.back_ = (wait_op *)0x0;
    local_118 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_88._M_p = (pointer)&local_78;
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_68._M_p = (pointer)&local_58;
    local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_local_buf[0] = '\0';
    local_48 = 0x100000708;
    local_40 = -1;
    uStack_3c = -1;
    iStack_38 = -1;
    iStack_34 = -1;
    lVar10 = 0;
    do {
      uVar12 = uVar12 << 8 | (uint)(byte)pcVar14[lVar10 + 8];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    psVar2 = ((this->super_tracker_connection).m_man)->m_settings;
    pmVar1 = &psVar2->m_mutex;
    local_178.ip._M_elems._0_4_ = SUB84(pmVar1,0);
    local_178.ip._M_elems._4_2_ = SUB82((ulong)pmVar1 >> 0x20,0);
    local_178.ip._M_elems._6_2_ = SUB82((ulong)pmVar1 >> 0x30,0);
    local_178.ip._M_elems[8] = '\0';
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_178);
    local_178.ip._M_elems[8] = '\x01';
    uVar13 = (psVar2->m_store).m_ints._M_elems[0x37];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_178);
    if ((int)uVar13 < (int)uVar12) {
      uVar13 = uVar12;
    }
    local_48 = CONCAT44(0x3c,uVar13);
    uStack_3c = 0;
    lVar10 = 0;
    do {
      uStack_3c = uStack_3c << 8 | (uint)(byte)pcVar14[lVar10 + 0xc];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_40 = 0;
    lVar10 = 0;
    do {
      local_40 = local_40 << 8 | (uint)(byte)pcVar14[lVar10 + 0x10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    lVar15 = buf.m_len + -0x14;
    lVar10 = 0x12;
    if ((this->m_target).impl_.data_.base.sa_family == 2) {
      lVar10 = 6;
    }
    __n = lVar15 / lVar10;
    bVar19 = lVar15 % lVar10 == 0;
    uVar12 = (uint)bVar19;
    if (bVar19) {
      tracker_connection::requester((tracker_connection *)local_150);
      if (((_func_int **)local_150._0_8_ == (_func_int **)0x0) ||
         ((**(code **)(*(_func_int **)local_150._0_8_ + 0x38))
                    (local_150._0_8_,"<== UDP_TRACKER_RESPONSE [ url: %s ]",
                     (this->super_tracker_connection).m_req.url._M_dataplus._M_p),
         (_func_int **)local_150._0_8_ == (_func_int **)0x0)) {
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])(this);
      }
      else {
        puVar18 = (uchar *)(pcVar14 + 0x14);
        local_158 = this;
        if ((this->m_target).impl_.data_.base.sa_family == 2) {
          ::std::
          vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
          ::reserve((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                     *)(local_118 + 8),__n);
          if (0 < (long)__n) {
            do {
              local_178.ip._M_elems._0_4_ = *(undefined4 *)puVar18;
              local_178.ip._M_elems._4_2_ =
                   *(ushort *)(puVar18 + 4) << 8 | *(ushort *)(puVar18 + 4) >> 8;
              if (local_108.front_ == local_108.back_) {
                ::std::
                vector<libtorrent::aux::ipv4_peer_entry,std::allocator<libtorrent::aux::ipv4_peer_entry>>
                ::_M_realloc_insert<libtorrent::aux::ipv4_peer_entry_const&>
                          ((vector<libtorrent::aux::ipv4_peer_entry,std::allocator<libtorrent::aux::ipv4_peer_entry>>
                            *)(local_118 + 8),(iterator)local_108.front_,
                           (ipv4_peer_entry *)&local_178);
              }
              else {
                *(undefined2 *)((long)local_108.front_ + 4) = local_178.ip._M_elems._4_2_;
                *(undefined4 *)((bytes_type *)&(local_108.front_)->super_operation)->_M_elems =
                     local_178.ip._M_elems._0_4_;
                local_108.front_ = (wait_op *)((long)local_108.front_ + 6);
              }
              puVar18 = puVar18 + 6;
              __n = __n - 1;
            } while (__n != 0);
          }
        }
        else {
          ::std::
          vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
          ::reserve((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                     *)local_f8,__n);
          if (0 < (long)__n) {
            do {
              uVar5 = *(undefined8 *)puVar18;
              uVar6 = *(undefined8 *)(puVar18 + 8);
              local_178.ip._M_elems._0_4_ = SUB84(uVar5,0);
              local_178.ip._M_elems._4_2_ = SUB82((ulong)uVar5 >> 0x20,0);
              local_178.ip._M_elems._6_2_ = SUB82((ulong)uVar5 >> 0x30,0);
              local_178.ip._M_elems[8] = (uchar)uVar6;
              local_178.ip._M_elems._9_7_ = SUB87((ulong)uVar6 >> 8,0);
              local_178.port = *(ushort *)(puVar18 + 0x10) << 8 | *(ushort *)(puVar18 + 0x10) >> 8;
              if (iStack_f0._M_current == (ipv6_peer_entry *)local_e8._0_8_) {
                ::std::
                vector<libtorrent::aux::ipv6_peer_entry,std::allocator<libtorrent::aux::ipv6_peer_entry>>
                ::_M_realloc_insert<libtorrent::aux::ipv6_peer_entry_const&>
                          (local_f8,iStack_f0,&local_178);
              }
              else {
                (iStack_f0._M_current)->port = local_178.port;
                *(undefined8 *)((iStack_f0._M_current)->ip)._M_elems = uVar5;
                *(undefined8 *)(((iStack_f0._M_current)->ip)._M_elems + 8) = uVar6;
                iStack_f0._M_current = iStack_f0._M_current + 1;
              }
              puVar18 = puVar18 + 0x12;
              __n = __n - 1;
            } while (__n != 0);
          }
        }
        local_150._16_8_ = local_150 + 0x10;
        local_130.__d.__r = (duration)0;
        pbVar3 = (local_158->m_endpoints).
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_150._24_8_ = local_150._16_8_;
        for (pbVar17 = (local_158->m_endpoints).
                       super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar8 = local_158,
            pbVar17 != pbVar3; pbVar17 = pbVar17 + 1) {
          bVar19 = (pbVar17->impl_).data_.base.sa_family != 2;
          if (bVar19) {
            uVar5 = *(undefined8 *)((long)&(pbVar17->impl_).data_ + 8);
            uVar6 = *(undefined8 *)((long)&(pbVar17->impl_).data_ + 0x10);
            local_178.ip._M_elems._0_4_ = SUB84(uVar5,0);
            local_178.ip._M_elems._4_2_ = SUB82((ulong)uVar5 >> 0x20,0);
            local_178.ip._M_elems._6_2_ = SUB82((ulong)uVar5 >> 0x30,0);
            local_178.ip._M_elems[8] = (uchar)uVar6;
            local_178.ip._M_elems._9_7_ = SUB87((ulong)uVar6 >> 8,0);
            p_Var16 = (_List_node_base *)(ulong)(pbVar17->impl_).data_.v6.sin6_scope_id;
            iVar9 = 0;
          }
          else {
            iVar9 = (pbVar17->impl_).data_.v4.sin_addr.s_addr;
            local_178.ip._M_elems[0] = '\0';
            local_178.ip._M_elems[1] = '\0';
            local_178.ip._M_elems[2] = '\0';
            local_178.ip._M_elems[3] = '\0';
            local_178.ip._M_elems[4] = '\0';
            local_178.ip._M_elems[5] = '\0';
            local_178.ip._M_elems[6] = '\0';
            local_178.ip._M_elems[7] = '\0';
            local_178.ip._M_elems[8] = '\0';
            local_178.ip._M_elems[9] = '\0';
            local_178.ip._M_elems[10] = '\0';
            local_178.ip._M_elems[0xb] = '\0';
            local_178.ip._M_elems[0xc] = '\0';
            local_178.ip._M_elems[0xd] = '\0';
            local_178.ip._M_elems[0xe] = '\0';
            local_178.ip._M_elems[0xf] = '\0';
            p_Var16 = (_List_node_base *)0x0;
          }
          p_Var11 = (_List_node_base *)operator_new(0x30);
          *(uint *)&p_Var11[1]._M_next = (uint)bVar19;
          *(in_addr_t *)((long)&p_Var11[1]._M_next + 4) = iVar9;
          p_Var11[1]._M_prev =
               (_List_node_base *)
               CONCAT26(local_178.ip._M_elems._6_2_,
                        CONCAT24(local_178.ip._M_elems._4_2_,local_178.ip._M_elems._0_4_));
          p_Var11[2]._M_next =
               (_List_node_base *)CONCAT71(local_178.ip._M_elems._9_7_,local_178.ip._M_elems[8]);
          p_Var11[2]._M_prev = p_Var16;
          ::std::__detail::_List_node_base::_M_hook(p_Var11);
          local_130.__d.__r = (duration)((long)local_130.__d.__r + 1);
        }
        bVar19 = (local_158->m_target).impl_.data_.base.sa_family != 2;
        if (bVar19) {
          uVar5 = *(undefined8 *)((long)&(local_158->m_target).impl_.data_ + 8);
          uVar6 = *(undefined8 *)((long)&(local_158->m_target).impl_.data_ + 0x10);
          local_178.ip._M_elems[8] = (uchar)uVar5;
          local_178.ip._M_elems._9_7_ = SUB87((ulong)uVar5 >> 8,0);
          local_178.port = (uint16_t)uVar6;
          uStack_166 = (undefined6)((ulong)uVar6 >> 0x10);
          local_160 = (ulong)(local_158->m_target).impl_.data_.v6.sin6_scope_id;
          iVar9 = 0;
        }
        else {
          iVar9 = (local_158->m_target).impl_.data_.v4.sin_addr.s_addr;
          local_178.ip._M_elems[8] = '\0';
          local_178.ip._M_elems[9] = '\0';
          local_178.ip._M_elems[10] = '\0';
          local_178.ip._M_elems[0xb] = '\0';
          local_178.ip._M_elems[0xc] = '\0';
          local_178.ip._M_elems[0xd] = '\0';
          local_178.ip._M_elems[0xe] = '\0';
          local_178.ip._M_elems[0xf] = '\0';
          local_178.port = 0;
          uStack_166 = 0;
          local_160 = 0;
        }
        local_178.ip._M_elems._0_4_ = ZEXT14(bVar19);
        local_178.ip._M_elems._4_2_ = SUB42(iVar9,0);
        local_178.ip._M_elems._6_2_ = SUB42(iVar9 >> 0x10,0);
        (**(code **)(*(_func_int **)local_150._0_8_ + 0x20))
                  (local_150._0_8_,&(local_158->super_tracker_connection).m_req,&local_178,
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 0x10),local_128);
        (*(puVar8->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])(puVar8)
        ;
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._16_8_;
        while (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 0x10)) {
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7->_vptr__Sp_counted_base;
          operator_delete(p_Var7,0x30);
          p_Var7 = p_Var4;
        }
      }
      if ((element_type *)local_150._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
    }
    else {
      eVar20 = errors::make_error_code(invalid_tracker_response_length);
      local_178.ip._M_elems._0_4_ = eVar20.val_;
      local_178.ip._M_elems._4_2_ = eVar20._4_2_;
      local_178.ip._M_elems._6_2_ = eVar20._6_2_;
      local_178.ip._M_elems[8] = (uchar)eVar20.cat_;
      local_178.ip._M_elems._9_7_ = eVar20.cat_._1_7_;
      fail(this,(error_code *)&local_178,bittorrent,"",(seconds32)0x0,(seconds32)0x1e);
    }
    tracker_response::~tracker_response((tracker_response *)local_128);
  }
  return SUB41(uVar12,0);
}

Assistant:

bool udp_tracker_connection::on_announce_response(span<char const> buf)
	{
		if (buf.size() < 20) return false;

		buf = buf.subspan(8);
		restart_read_timeout();

		tracker_response resp;

		resp.interval = std::max(seconds32(aux::read_int32(buf))
				, seconds32(m_man.settings().get_int(settings_pack::min_announce_interval)));
		resp.min_interval = seconds32(60);
		resp.incomplete = aux::read_int32(buf);
		resp.complete = aux::read_int32(buf);

		int const ip_stride = aux::is_v6(m_target) ? 18 : 6;
		auto const num_peers = buf.size() / ip_stride;
		if (buf.size() % ip_stride != 0)
		{
			fail(error_code(errors::invalid_tracker_response_length), operation_t::bittorrent);
			return false;
		}

		std::shared_ptr<request_callback> cb = requester();
#ifndef TORRENT_DISABLE_LOGGING
		if (cb)
		{
			cb->debug_log("<== UDP_TRACKER_RESPONSE [ url: %s ]", tracker_req().url.c_str());
		}
#endif

		if (!cb)
		{
			close();
			return true;
		}

		if (aux::is_v6(m_target))
		{
			resp.peers6.reserve(static_cast<std::size_t>(num_peers));
			for (int i = 0; i < num_peers; ++i)
			{
				ipv6_peer_entry e{};
				std::memcpy(e.ip.data(), buf.data(), 16);
				buf = buf.subspan(16);
				e.port = aux::read_uint16(buf);
				resp.peers6.push_back(e);
			}
		}
		else
		{
			resp.peers4.reserve(static_cast<std::size_t>(num_peers));
			for (int i = 0; i < num_peers; ++i)
			{
				ipv4_peer_entry e{};
				std::memcpy(e.ip.data(), buf.data(), 4);
				buf = buf.subspan(4);
				e.port = aux::read_uint16(buf);
				resp.peers4.push_back(e);
			}
		}

		// TODO: why is this a linked list?
		std::list<address> ip_list;
		std::transform(m_endpoints.begin(), m_endpoints.end(), std::back_inserter(ip_list)
			, [](tcp::endpoint const& ep) { return ep.address(); } );

		cb->tracker_response(tracker_req(), m_target.address(), ip_list, resp);

		close();
		return true;
	}